

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colWord.c
# Opt level: O2

intptr_t Col_IntWordValue(Col_Word word)

{
  uint uVar1;
  
  if (word != 0) {
    if ((word & 0xf) == 0) {
      if ((*(byte *)word & 2) == 0) {
        return 0;
      }
      uVar1 = *(byte *)word & 0xfffffffe;
    }
    else {
      uVar1 = immediateWordTypes[(uint)word & 0x1f];
    }
    if (uVar1 == 2) {
      if (*(short *)(word + 2) == 4) {
        return *(intptr_t *)(word + 0x10);
      }
    }
    else if (uVar1 == 0xfffffffe) {
      return (long)word >> 1;
    }
  }
  return 0;
}

Assistant:

intptr_t
Col_IntWordValue(
    Col_Word word)  /*!< Integer word to get value for. */
{
    switch (WORD_TYPE(word)) {
    case WORD_TYPE_SMALLINT:
        return WORD_SMALLINT_VALUE(word);

    case WORD_TYPE_WRAP:
        if (WORD_WRAP_TYPE(word) == COL_INT) {
            return WORD_INTWRAP_VALUE(word);
        }
    }

    /*! @typecheck{COL_ERROR_INT,word} */
    TYPECHECK(0, COL_ERROR_INT, word);

    return 0;
}